

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMeshSceneNode.cpp
# Opt level: O0

void __thiscall irr::scene::CMeshSceneNode::OnRegisterSceneNode(CMeshSceneNode *this)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 *puVar3;
  ulong uVar4;
  ISceneNode *in_RDI;
  SMaterial *material;
  u32 i;
  u32 numMaterials;
  int solidCount;
  int transparentCount;
  IVideoDriver *driver;
  u32 in_stack_ffffffffffffffbc;
  SMaterial *in_stack_ffffffffffffffc0;
  uint local_34;
  uint local_20;
  int local_18;
  int local_14;
  
  if (((in_RDI->IsVisible & 1U) != 0) &&
     (lVar1._0_4_ = in_RDI[1].DebugDataVisible, lVar1._4_1_ = in_RDI[1].IsVisible,
     lVar1._5_1_ = in_RDI[1].IsDebugObject, lVar1._6_2_ = *(undefined2 *)&in_RDI[1].field_0xde,
     lVar1 != 0)) {
    iVar2 = (*in_RDI->SceneManager->_vptr_ISceneManager[2])();
    *(undefined4 *)&in_RDI[1].field_0xe0 = 0;
    local_14 = 0;
    local_18 = 0;
    if ((in_RDI[1].field_0xe4 & 1) == 0) {
      local_34 = core::array<irr::video::SMaterial>::size((array<irr::video::SMaterial> *)0x2c390d);
    }
    else {
      local_34 = (**(code **)**(undefined8 **)&in_RDI[1].DebugDataVisible)();
    }
    for (local_20 = 0; local_20 < local_34; local_20 = local_20 + 1) {
      if ((in_RDI[1].field_0xe4 & 1) == 0) {
        in_stack_ffffffffffffffc0 =
             core::array<irr::video::SMaterial>::operator[]
                       ((array<irr::video::SMaterial> *)in_stack_ffffffffffffffc0,
                        in_stack_ffffffffffffffbc);
      }
      else {
        puVar3 = (undefined8 *)
                 (**(code **)(**(long **)&in_RDI[1].DebugDataVisible + 8))
                           (*(long **)&in_RDI[1].DebugDataVisible,local_20);
        in_stack_ffffffffffffffc0 = (SMaterial *)(**(code **)*puVar3)();
      }
      uVar4 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x338))
                        ((long *)CONCAT44(extraout_var,iVar2),in_stack_ffffffffffffffc0);
      if ((uVar4 & 1) == 0) {
        local_18 = local_18 + 1;
      }
      else {
        local_14 = local_14 + 1;
      }
      if ((local_18 != 0) && (local_14 != 0)) break;
    }
    if (local_18 != 0) {
      (*in_RDI->SceneManager->_vptr_ISceneManager[0x10])(in_RDI->SceneManager,in_RDI,8);
    }
    if (local_14 != 0) {
      (*in_RDI->SceneManager->_vptr_ISceneManager[0x10])(in_RDI->SceneManager,in_RDI,0x10);
    }
    ISceneNode::OnRegisterSceneNode(in_RDI);
  }
  return;
}

Assistant:

void CMeshSceneNode::OnRegisterSceneNode()
{
	if (IsVisible && Mesh) {
		// because this node supports rendering of mixed mode meshes consisting of
		// transparent and solid material at the same time, we need to go through all
		// materials, check of what type they are and register this node for the right
		// render pass according to that.

		video::IVideoDriver *driver = SceneManager->getVideoDriver();

		PassCount = 0;
		int transparentCount = 0;
		int solidCount = 0;

		// count transparent and solid materials in this scene node
		const u32 numMaterials = ReadOnlyMaterials ? Mesh->getMeshBufferCount() : Materials.size();
		for (u32 i = 0; i < numMaterials; ++i) {
			const video::SMaterial &material = ReadOnlyMaterials ? Mesh->getMeshBuffer(i)->getMaterial() : Materials[i];

			if (driver->needsTransparentRenderPass(material))
				++transparentCount;
			else
				++solidCount;

			if (solidCount && transparentCount)
				break;
		}

		// register according to material types counted

		if (solidCount)
			SceneManager->registerNodeForRendering(this, scene::ESNRP_SOLID);

		if (transparentCount)
			SceneManager->registerNodeForRendering(this, scene::ESNRP_TRANSPARENT);

		ISceneNode::OnRegisterSceneNode();
	}
}